

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::coTest(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int i,Status stat)

{
  bool *pbVar1;
  int32_t iVar2;
  int iVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  long lVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  byte bVar10;
  type t;
  cpp_dec_float<200U,_int,_void> local_128;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar10 = 0;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x1c;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems[0xe] = 0;
  local_128.data._M_elems[0xf] = 0;
  local_128.data._M_elems[0x10] = 0;
  local_128.data._M_elems[0x11] = 0;
  local_128.data._M_elems[0x12] = 0;
  local_128.data._M_elems[0x13] = 0;
  local_128.data._M_elems[0x14] = 0;
  local_128.data._M_elems[0x15] = 0;
  local_128.data._M_elems[0x16] = 0;
  local_128.data._M_elems[0x17] = 0;
  local_128.data._M_elems[0x18] = 0;
  local_128.data._M_elems[0x19] = 0;
  local_128.data._M_elems._104_5_ = 0;
  local_128.data._M_elems[0x1b]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    pcVar6 = &(this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar4 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 0x1c;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems[6] = 0;
    local_a8.data._M_elems[7] = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.data._M_elems[10] = 0;
    local_a8.data._M_elems[0xb] = 0;
    local_a8.data._M_elems[0xc] = 0;
    local_a8.data._M_elems[0xd] = 0;
    local_a8.data._M_elems[0xe] = 0;
    local_a8.data._M_elems[0xf] = 0;
    local_a8.data._M_elems[0x10] = 0;
    local_a8.data._M_elems[0x11] = 0;
    local_a8.data._M_elems[0x12] = 0;
    local_a8.data._M_elems[0x13] = 0;
    local_a8.data._M_elems[0x14] = 0;
    local_a8.data._M_elems[0x15] = 0;
    local_a8.data._M_elems[0x16] = 0;
    local_a8.data._M_elems[0x17] = 0;
    local_a8.data._M_elems[0x18] = 0;
    local_a8.data._M_elems[0x19] = 0;
    local_a8.data._M_elems._104_5_ = 0;
    local_a8.data._M_elems[0x1b]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    if (&local_a8 == pcVar4) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_a8,pcVar6);
      if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
        local_a8.neg = (bool)(local_a8.neg ^ 1);
      }
    }
    else {
      if (&local_a8 != pcVar6) {
        pcVar7 = pcVar6;
        pcVar8 = &local_a8;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar8->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((pcVar7->data)._M_elems + 1);
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((pcVar8->data)._M_elems + 1);
        }
        local_a8.exp = pcVar6->exp;
        local_a8.neg = pcVar6->neg;
        local_a8.fpclass = pcVar6->fpclass;
        local_a8.prec_elem = pcVar6->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_a8,pcVar4);
    }
    pcVar4 = &local_a8;
    pcVar6 = &local_128;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(uint *)pcVar6 = (pcVar4->data)._M_elems[0];
      pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar10 * -8 + 4);
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    local_128.exp = local_a8.exp;
    local_128.neg = local_a8.neg;
    local_128.fpclass = local_a8.fpclass;
    local_128.prec_elem = local_a8.prec_elem;
    if (local_a8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_a8,0,(type *)0x0);
      iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_128,&local_a8);
      if (iVar3 < 0) {
        pcVar4 = &local_128;
        pnVar9 = __return_storage_ptr__;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = *(uint *)pcVar4;
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + ((ulong)bVar10 * -2 + 1) * 4);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
        }
        (__return_storage_ptr__->m_backend).exp = local_128.exp;
        (__return_storage_ptr__->m_backend).neg = local_128.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_128.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_128.prec_elem;
        return __return_storage_ptr__;
      }
    }
  case D_ON_LOWER:
    pcVar6 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar4 = &(this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
    goto LAB_00512384;
  case D_ON_UPPER:
    pcVar6 = &(this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar4 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case P_ON_LOWER:
    pcVar6 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar4 = &(this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  default:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    return __return_storage_ptr__;
  case P_ON_UPPER:
    pcVar6 = &(this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar4 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
LAB_00512384:
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  if (pcVar4 == &__return_storage_ptr__->m_backend) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar6);
    if ((__return_storage_ptr__->m_backend).data._M_elems[0] != 0 ||
        (__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_finite) {
      pbVar1 = &(__return_storage_ptr__->m_backend).neg;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
    }
  }
  else {
    if (pcVar6 != &__return_storage_ptr__->m_backend) {
      pcVar7 = pcVar6;
      pnVar9 = __return_storage_ptr__;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      (__return_storage_ptr__->m_backend).exp = pcVar6->exp;
      (__return_storage_ptr__->m_backend).neg = pcVar6->neg;
      iVar2 = pcVar6->prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = pcVar6->fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = iVar2;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}